

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

String * Rml::Parse::VariableExpression
                   (String *__return_storage_ptr__,DataParser *parser,String *address_prefix)

{
  byte bVar1;
  size_t sVar2;
  pointer pcVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  String *extraout_RAX_00;
  bool *in_RCX;
  size_type sVar6;
  String prefix;
  String index;
  ProgramState backup_state;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  ProgramState local_118;
  Variant local_108;
  Variant local_e0;
  Variant local_b8;
  Variant local_90;
  Variant local_68;
  String local_40;
  
  if (parser->reached_end == false) {
    sVar2 = parser->index;
    bVar1 = (parser->expression)._M_dataplus._M_p[sVar2];
    in_RCX = (bool *)(ulong)bVar1;
    if (bVar1 == 0x2e) {
      parser->index = sVar2 + 1;
      if ((parser->expression)._M_string_length <= sVar2 + 1) {
        parser->reached_end = true;
      }
      local_178._0_8_ = &((String *)local_178)->field_2;
      pcVar3 = (address_prefix->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,pcVar3,pcVar3 + address_prefix->_M_string_length);
      ::std::__cxx11::string::append((char *)local_178);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)VariableExpression(__return_storage_ptr__,parser,(String *)local_178);
    }
    else {
      if (bVar1 != 0x5b) goto LAB_001f32ba;
      parser->index = sVar2 + 1;
      if ((parser->expression)._M_string_length <= sVar2 + 1) {
        parser->reached_end = true;
      }
      local_178._0_8_ = &((String *)local_178)->field_2;
      pcVar3 = (address_prefix->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,pcVar3,pcVar3 + address_prefix->_M_string_length);
      ::std::__cxx11::string::push_back((char)(String *)local_178);
      local_118.program_length =
           ((long)(parser->program).
                  super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(parser->program).
                  super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      local_118.stack_size = parser->program_stack_size;
      FindNumberLiteral_abi_cxx11_
                ((String *)&local_158,(Parse *)parser,(DataParser *)0x1,
                 SUB81(local_118.program_length,0));
      if (((local_158._8_8_ == 0) || (parser->reached_end != false)) ||
         ((parser->expression)._M_dataplus._M_p[parser->index] != ']')) {
        DataParser::SetProgramState(parser,&local_118);
        local_68.type = NONE;
        Variant::Set(&local_68,(String *)local_178);
        DataParser::Emit(parser,Literal,&local_68);
        Variant::~Variant(&local_68);
        DataParser::Push(parser);
        Expression(parser);
        Variant::Variant(&local_90);
        DataParser::Emit(parser,CastToInt,&local_90);
        Variant::~Variant(&local_90);
        DataParser::Push(parser);
        DataParser::Match(parser,']',true);
        local_128._M_allocated_capacity._0_2_ = 0x5d;
        local_138._8_8_ = 1;
        local_138._M_allocated_capacity = (size_type)&local_128;
        VariableExpression(&local_40,parser,(String *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_allocated_capacity != &local_128) {
          operator_delete((void *)local_138._M_allocated_capacity,
                          CONCAT62(local_128._M_allocated_capacity._2_6_,
                                   local_128._M_allocated_capacity._0_2_) + 1);
        }
        DataParser::Pop(parser,L);
        Variant::Variant(&local_b8);
        DataParser::Emit(parser,Add,&local_b8);
        Variant::~Variant(&local_b8);
        DataParser::Pop(parser,L);
        Variant::Variant(&local_e0);
        DataParser::Emit(parser,Add,&local_e0);
        Variant::~Variant(&local_e0);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        uVar4 = parser->index + 1;
        parser->index = uVar4;
        if ((parser->expression)._M_string_length <= uVar4) {
          parser->reached_end = true;
        }
        ::std::__cxx11::string::_M_append((char *)local_178,local_158._M_allocated_capacity);
        ::std::__cxx11::string::push_back((char)(String *)local_178);
        VariableExpression(__return_storage_ptr__,parser,(String *)local_178);
      }
      paVar5 = &local_148;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_allocated_capacity != paVar5) {
        operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1)
        ;
        paVar5 = extraout_RAX;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._0_8_ == &((String *)local_178)->field_2) {
      return (String *)paVar5;
    }
  }
  else {
LAB_001f32ba:
    VariableOrFunctionName_abi_cxx11_((String *)local_178,(Parse *)parser,(DataParser *)0x0,in_RCX);
    if (local_178._8_8_ == 0) {
      if (address_prefix->_M_string_length == 0) {
        sVar6 = 0;
      }
      else {
        local_108.type = NONE;
        Variant::Set(&local_108,address_prefix);
        DataParser::Emit(parser,Literal,&local_108);
        Variant::~Variant(&local_108);
        sVar6 = address_prefix->_M_string_length;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (address_prefix->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar6);
    }
    else {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,address_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178);
      VariableExpression(__return_storage_ptr__,parser,(String *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_allocated_capacity != &local_148) {
        operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1)
        ;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._0_8_ == &((String *)local_178)->field_2) {
      return (String *)&((String *)local_178)->field_2;
    }
  }
  operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  return extraout_RAX_00;
}

Assistant:

static String VariableExpression(DataParser& parser, const String& address_prefix)
	{
		if (parser.Look() == '[')
		{
			parser.Next();
			String prefix = address_prefix;

			prefix.push_back('[');

			// Backup program state before trying to parse number inside brackets.
			// Could turn out to be expression and needs reparsing
			auto backup_state = parser.GetProgramState();

			String index = FindNumberLiteral(parser, true);
			if (!index.empty() && parser.Look() == ']')
			{
				parser.Next();
				prefix.append(index);
				prefix.push_back(']');
				return VariableExpression(parser, prefix);
			}
			else
			{
				parser.SetProgramState(backup_state);

				parser.Emit(Instruction::Literal, Variant(prefix));
				parser.Push();

				Expression(parser);
				parser.Emit(Instruction::CastToInt);
				parser.Push();

				parser.Match(']');
				VariableExpression(parser, "]");

				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());
				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());

				return "";
			}
		}
		else if (parser.Look() == '.')
		{
			parser.Next();
			return VariableExpression(parser, address_prefix + ".");
		}
		else
		{
			String next = VariableOrFunctionName(parser, nullptr);
			if (next.empty())
			{
				if (!address_prefix.empty())
					parser.Emit(Instruction::Literal, Variant(address_prefix));
				return address_prefix;
			}
			return VariableExpression(parser, address_prefix + next);
		}
	}